

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::LibraryIncDirClauseSyntax::getChildPtr(LibraryIncDirClauseSyntax *this,size_t index)

{
  long in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffc0;
  PtrTokenOrSyntax *local_10;
  
  if (in_RSI == 0) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
  }
  else if (in_RSI == 1) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
  }
  else if (in_RSI == 2) {
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x38),in_stack_ffffffffffffffb8);
  }
  else {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax LibraryIncDirClauseSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &minus;
        case 1: return &incdir;
        case 2: return &filePaths;
        default: return nullptr;
    }
}